

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
* libcellml::getAllImportSources
            (vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
             *__return_storage_ptr__,ModelConstPtr *model)

{
  shared_ptr<libcellml::Component> *component;
  pointer psVar1;
  pointer psVar2;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  importedUnits;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  importedComponents;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  local_68;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_50;
  ImportedEntity local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model_const,void>
            ((__shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &model->super___shared_ptr<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
  getImportedComponents(&local_50,(ComponentEntityConstPtr *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.
              super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  getImportedUnits(&local_68,model);
  std::
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)local_68.
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) +
            ((long)local_50.
                   super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.
                   super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  for (psVar1 = local_50.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 != local_50.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar1 = psVar1 + 1) {
    ImportedEntity::importSource(&local_38);
    std::
    vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
    ::emplace_back<std::shared_ptr<libcellml::ImportSource>>
              ((vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
                *)__return_storage_ptr__,(shared_ptr<libcellml::ImportSource> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.mPimpl);
  }
  for (psVar2 = local_68.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != local_68.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    ImportedEntity::importSource(&local_38);
    std::
    vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
    ::emplace_back<std::shared_ptr<libcellml::ImportSource>>
              ((vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
                *)__return_storage_ptr__,(shared_ptr<libcellml::ImportSource> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.mPimpl);
  }
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  ~vector(&local_68);
  std::
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ::~vector(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ImportSourcePtr> getAllImportSources(const ModelConstPtr &model)
{
    std::vector<ImportSourcePtr> importSources;

    auto importedComponents = getImportedComponents(model);
    auto importedUnits = getImportedUnits(model);

    importSources.reserve(importedComponents.size() + importedUnits.size());
    for (auto &component : importedComponents) {
        importSources.push_back(component->importSource());
    }
    for (auto &units : importedUnits) {
        importSources.push_back(units->importSource());
    }

    return importSources;
}